

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O2

QSize __thiscall
QStyledItemDelegate::sizeHint
          (QStyledItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  QWidget *this_00;
  QSize QVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  undefined8 local_120;
  QStyleOptionViewItem opt;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_48,index,0xd);
  if (puStack_30 < (undefined1 *)0x4) {
    memset(&opt,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&opt,option);
    (**(code **)(*(long *)this + 0xb8))(this,&opt,index);
    this_00 = option->widget;
    if (this_00 == (QWidget *)0x0) {
      pQVar2 = QApplication::style();
    }
    else {
      pQVar2 = QWidget::style(this_00);
    }
    local_120 = 0xffffffffffffffff;
    QVar1 = (QSize)(**(code **)(*(long *)pQVar2 + 0xe8))(pQVar2,0x16,&opt,&local_120,this_00);
    QStyleOptionViewItem::~QStyleOptionViewItem(&opt);
  }
  else {
    QVar1 = qvariant_cast<QSize>((QVariant *)&local_48);
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QSize QStyledItemDelegate::sizeHint(const QStyleOptionViewItem &option,
                                   const QModelIndex &index) const
{
    QVariant value = index.data(Qt::SizeHintRole);
    if (value.isValid())
        return qvariant_cast<QSize>(value);

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);
    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    return style->sizeFromContents(QStyle::CT_ItemViewItem, &opt, QSize(), widget);
}